

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_function
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  bool bVar2;
  Atom *this_00;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  bool bVar3;
  int iVar4;
  allocator local_171;
  uint local_170;
  undefined4 local_16c;
  uint16_t *local_168;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f0;
  string local_e0;
  Class _p;
  Class local_78;
  
  local_16c = (undefined4)CONCAT71(in_register_00000011,enforce);
  local_168 = extent_index;
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = read_nil_fid(this,(Ptr *)&local_f0,write_index,(uint16_t *)p,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  bVar3 = true;
  if (!bVar1) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
              );
    Class::Class(&local_78,FUNCTION_ID);
    bVar1 = read_variable(this,(Ptr *)&local_160,write_index,(uint16_t *)p,write,&local_78);
    Class::~Class(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
    if (!bVar1) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      extent_index_00 = local_168;
      bVar1 = read_reference(this,(Ptr *)&local_100,write_index,local_168,write,FUNCTION_ID);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
      if (!bVar1) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_110,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar1 = read_wildcard(this,(Ptr *)&local_110,write_index,extent_index_00,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
        if (!bVar1) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_120,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar1 = read_tail_wildcard(this,(Ptr *)&local_120,write_index,extent_index_00,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
          if (!bVar1) {
            Class::Class(&_p,ANY);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_130,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar1 = function(this,(Ptr *)&local_130,&_p);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount)
            ;
            if (bVar1) {
              bVar3 = true;
              if (write) {
                this_00 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(this->current_object + 8),
                                     (ulong)write_index);
                r_code::Atom::operator=(this_00,&_p.atom);
              }
            }
            else {
              local_170 = (uint)(this->state).pattern_lvl;
              bVar1 = (this->state).no_arity_check;
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_140,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              bVar2 = expression(this,(Ptr *)&local_140,FUNCTION_ID,write_index,local_168,write);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_140._M_refcount);
              bVar3 = true;
              if (!bVar2) {
                iVar4 = (uint)bVar1 * 0x10000 + local_170;
                (this->state).pattern_lvl = (uint16_t)iVar4;
                (this->state).no_arity_check = SUB41((uint)iVar4 >> 0x10,0);
                if ((char)local_16c != '\0') {
                  std::__cxx11::string::string
                            ((string *)&local_e0," error: expected a device function",&local_171);
                  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_150,
                             &node->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
                  set_error(this,&local_e0,(Ptr *)&local_150);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_150._M_refcount);
                  std::__cxx11::string::~string((string *)&local_e0);
                }
                bVar3 = false;
              }
            }
            Class::~Class(&_p);
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool Compiler::read_function(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL
{
    if (read_nil_fid(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, FUNCTION_ID)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, FUNCTION_ID)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    Class _p;

    if (function(node, _p)) { // TODO: _p shall be used to parse the args in the embedding expression
        if (write) {
            current_object->code[write_index] = _p.atom;
        }

        return true;
    }

    State s = save_state();

    if (expression(node, FUNCTION_ID, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a device function", node);
        return false;
    }

    return false;
}